

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O0

size_t WebRtc_available_read(RingBuffer *self)

{
  RingBuffer *self_local;
  
  if (self == (RingBuffer *)0x0) {
    self_local = (RingBuffer *)0x0;
  }
  else if (self->rw_wrap == SAME_WRAP) {
    self_local = (RingBuffer *)(self->write_pos - self->read_pos);
  }
  else {
    self_local = (RingBuffer *)((self->element_count - self->read_pos) + self->write_pos);
  }
  return (size_t)self_local;
}

Assistant:

size_t WebRtc_available_read(const RingBuffer* self) {
  if (!self) {
    return 0;
  }

  if (self->rw_wrap == SAME_WRAP) {
    return self->write_pos - self->read_pos;
  } else {
    return self->element_count - self->read_pos + self->write_pos;
  }
}